

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O0

uint16_t invert(uint16_t x,uint16_t q,uint64_t qrecip)

{
  uint16_t uVar1;
  undefined4 local_28;
  undefined4 local_24;
  uint32_t exp;
  uint32_t acc;
  uint32_t bit;
  uint32_t sq;
  uint64_t qrecip_local;
  uint16_t q_local;
  uint16_t x_local;
  
  acc = (uint32_t)x;
  exp = 1;
  local_24 = 1;
  local_28 = q - 2;
  do {
    if ((local_28 & exp) != 0) {
      uVar1 = reduce(local_24 * acc,q,qrecip);
      local_24 = (uint)uVar1;
      local_28 = (exp ^ 0xffffffff) & local_28;
      if (local_28 == 0) {
        return uVar1;
      }
    }
    uVar1 = reduce(acc * acc,q,qrecip);
    acc = (uint32_t)uVar1;
    exp = exp << 1;
  } while( true );
}

Assistant:

static uint64_t invert(uint64_t a, uint64_t m)
{
    int64_t v0 = a, i0 = 1;
    int64_t v1 = m, i1 = 0;
    while (v0) {
        int64_t tmp, q = v1 / v0;
        tmp = v0; v0 = v1 - q*v0; v1 = tmp;
        tmp = i0; i0 = i1 - q*i0; i1 = tmp;
    }
    assert(v1 == 1 || v1 == -1);
    return i1 * v1;
}